

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O1

int KINBBDPrecInit(void *kinmem,sunindextype Nlocal,sunindextype mudq,sunindextype mldq,
                  sunindextype mukeep,sunindextype mlkeep,realtype dq_rel_uu,KINBBDLocalFn gloc,
                  KINBBDCommFn gcomm)

{
  double __x;
  long lVar1;
  int iVar2;
  long *__ptr;
  long lVar3;
  SUNMatrix p_Var4;
  N_Vector p_Var5;
  SUNLinearSolver S;
  long smu;
  int error_code;
  char *msgfmt;
  realtype rVar6;
  sunindextype lrw1;
  long liw;
  long lrw;
  long local_58;
  long local_50;
  realtype local_48;
  long local_40;
  long local_38;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "KINSOL Memory is NULL.";
    iVar2 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    goto LAB_0010cb90;
  }
  lVar1 = *(long *)((long)kinmem + 0x1f8);
  if (lVar1 == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    iVar2 = -2;
    error_code = -2;
    goto LAB_0010cb90;
  }
  if (*(long *)(*(long *)(*(long *)((long)kinmem + 0x140) + 8) + 0x28) == 0) {
    msgfmt = "A required vector operation is not implemented.";
    iVar2 = -3;
    error_code = -3;
    goto LAB_0010cb90;
  }
  local_48 = dq_rel_uu;
  __ptr = (long *)malloc(0x98);
  if (__ptr != (long *)0x0) {
    lVar3 = 0;
    if (mudq < 1) {
      mudq = lVar3;
    }
    smu = Nlocal + -1;
    if (Nlocal <= mudq) {
      mudq = smu;
    }
    if (mldq < 1) {
      mldq = lVar3;
    }
    __ptr[0x12] = (long)kinmem;
    if (Nlocal <= mldq) {
      mldq = smu;
    }
    __ptr[5] = (long)gloc;
    if (mukeep < 1) {
      mukeep = lVar3;
    }
    if (Nlocal <= mukeep) {
      mukeep = smu;
    }
    __ptr[6] = (long)gcomm;
    if (mlkeep < 1) {
      mlkeep = lVar3;
    }
    *__ptr = mudq;
    if (Nlocal <= mlkeep) {
      mlkeep = smu;
    }
    __ptr[1] = mldq;
    __ptr[2] = mukeep;
    __ptr[3] = mlkeep;
    if (mlkeep + mukeep < Nlocal) {
      smu = mlkeep + mukeep;
    }
    __ptr[8] = 0;
    p_Var4 = SUNBandMatrixStorage(Nlocal,mukeep,mlkeep,smu);
    __ptr[8] = (long)p_Var4;
    if (p_Var4 != (SUNMatrix)0x0) {
      __ptr[0xb] = 0;
      p_Var5 = N_VNew_Serial(Nlocal);
      __ptr[0xb] = (long)p_Var5;
      if (p_Var5 != (N_Vector)0x0) {
        __ptr[10] = 0;
        p_Var5 = N_VNewEmpty_Serial(Nlocal);
        __ptr[10] = (long)p_Var5;
        if (p_Var5 != (N_Vector)0x0) {
          __ptr[0xc] = 0;
          p_Var5 = N_VClone(*(N_Vector *)((long)kinmem + 0x140));
          __ptr[0xc] = (long)p_Var5;
          if (p_Var5 == (N_Vector)0x0) {
            N_VDestroy((N_Vector)__ptr[0xb]);
            p_Var5 = (N_Vector)__ptr[10];
          }
          else {
            __ptr[0xd] = 0;
            p_Var5 = N_VClone(*(N_Vector *)((long)kinmem + 0x140));
            __ptr[0xd] = (long)p_Var5;
            if (p_Var5 == (N_Vector)0x0) {
              N_VDestroy((N_Vector)__ptr[0xb]);
              N_VDestroy((N_Vector)__ptr[10]);
              p_Var5 = (N_Vector)__ptr[0xc];
            }
            else {
              __ptr[0xe] = 0;
              p_Var5 = N_VClone(*(N_Vector *)((long)kinmem + 0x140));
              __ptr[0xe] = (long)p_Var5;
              if (p_Var5 != (N_Vector)0x0) {
                __ptr[9] = 0;
                S = SUNLinSol_Band((N_Vector)__ptr[0xb],(SUNMatrix)__ptr[8]);
                __ptr[9] = (long)S;
                if (S != (SUNLinearSolver)0x0) {
                  iVar2 = SUNLinSolInitialize(S);
                  if (iVar2 == 0) {
                    rVar6 = local_48;
                    if (local_48 <= 0.0) {
                      __x = *kinmem;
                      rVar6 = 0.0;
                      if (0.0 < __x) {
                        if (__x < 0.0) {
                          rVar6 = sqrt(__x);
                        }
                        else {
                          rVar6 = SQRT(__x);
                        }
                      }
                    }
                    __ptr[4] = (long)rVar6;
                    __ptr[7] = Nlocal;
                    __ptr[0xf] = 0;
                    __ptr[0x10] = 0;
                    if ((*(N_Vector *)((long)kinmem + 0x140))->ops->nvspace !=
                        (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
                      N_VSpace(*(N_Vector *)((long)kinmem + 0x140),&local_50,&local_58);
                      __ptr[0xf] = __ptr[0xf] + local_50 * 3;
                      __ptr[0x10] = __ptr[0x10] + local_58 * 3;
                    }
                    if (((N_Vector)__ptr[0xb])->ops->nvspace !=
                        (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
                      N_VSpace((N_Vector)__ptr[0xb],&local_50,&local_58);
                      __ptr[0xf] = __ptr[0xf] + local_50;
                      __ptr[0x10] = __ptr[0x10] + local_58;
                    }
                    if (((N_Vector)__ptr[10])->ops->nvspace !=
                        (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
                      N_VSpace((N_Vector)__ptr[10],&local_50,&local_58);
                      __ptr[0xf] = __ptr[0xf] + local_50;
                      __ptr[0x10] = __ptr[0x10] + local_58;
                    }
                    if (((SUNMatrix)__ptr[8])->ops->space !=
                        (_func_int_SUNMatrix_long_ptr_long_ptr *)0x0) {
                      SUNMatSpace((SUNMatrix)__ptr[8],&local_38,&local_40);
                      __ptr[0xf] = __ptr[0xf] + local_38;
                      __ptr[0x10] = __ptr[0x10] + local_40;
                    }
                    if (((SUNLinearSolver)__ptr[9])->ops->space !=
                        (_func_int_SUNLinearSolver_long_ptr_long_ptr *)0x0) {
                      SUNLinSolSpace((SUNLinearSolver)__ptr[9],&local_38,&local_40);
                      __ptr[0xf] = __ptr[0xf] + local_38;
                      __ptr[0x10] = __ptr[0x10] + local_40;
                    }
                    __ptr[0x11] = 0;
                    if (*(code **)(lVar1 + 0x88) != (code *)0x0) {
                      (**(code **)(lVar1 + 0x88))(kinmem);
                    }
                    *(long **)(lVar1 + 0x90) = __ptr;
                    *(code **)(lVar1 + 0x88) = KINBBDPrecFree;
                    iVar2 = KINSetPreconditioner(kinmem,KINBBDPrecSetup,KINBBDPrecSolve);
                    return iVar2;
                  }
                  N_VDestroy((N_Vector)__ptr[0xb]);
                  N_VDestroy((N_Vector)__ptr[10]);
                  N_VDestroy((N_Vector)__ptr[0xc]);
                  N_VDestroy((N_Vector)__ptr[0xd]);
                  N_VDestroy((N_Vector)__ptr[0xe]);
                  SUNMatDestroy((SUNMatrix)__ptr[8]);
                  SUNLinSolFree((SUNLinearSolver)__ptr[9]);
                  free(__ptr);
                  msgfmt = "An error arose from a SUNBandLinearSolver routine.";
                  iVar2 = -8;
                  error_code = -8;
                  goto LAB_0010cb90;
                }
                N_VDestroy((N_Vector)__ptr[0xb]);
                N_VDestroy((N_Vector)__ptr[10]);
                N_VDestroy((N_Vector)__ptr[0xc]);
                N_VDestroy((N_Vector)__ptr[0xd]);
                p_Var5 = (N_Vector)__ptr[0xe];
                goto LAB_0010cb56;
              }
              N_VDestroy((N_Vector)__ptr[0xb]);
              N_VDestroy((N_Vector)__ptr[10]);
              N_VDestroy((N_Vector)__ptr[0xc]);
              p_Var5 = (N_Vector)__ptr[0xd];
            }
          }
          N_VDestroy(p_Var5);
          SUNMatDestroy((SUNMatrix)__ptr[8]);
          free(__ptr);
          goto LAB_0010cb8b;
        }
        p_Var5 = (N_Vector)__ptr[0xb];
LAB_0010cb56:
        N_VDestroy(p_Var5);
      }
      SUNMatDestroy((SUNMatrix)__ptr[8]);
    }
    free(__ptr);
  }
LAB_0010cb8b:
  msgfmt = "A memory request failed.";
  iVar2 = -4;
  error_code = -4;
LAB_0010cb90:
  KINProcessError((KINMem)kinmem,error_code,"KINBBDPRE","KINBBDPrecInit",msgfmt);
  return iVar2;
}

Assistant:

int KINBBDPrecInit(void *kinmem, sunindextype Nlocal, 
                   sunindextype mudq, sunindextype mldq,
                   sunindextype mukeep, sunindextype mlkeep,
                   realtype dq_rel_uu, 
                   KINBBDLocalFn gloc, KINBBDCommFn gcomm)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KBBDPrecData pdata;
  sunindextype muk, mlk, storage_mu, lrw1, liw1;
  long int lrw, liw;
  int flag;

  if (kinmem == NULL) {
    KINProcessError(NULL, KINLS_MEM_NULL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_NULL);
    return(KINLS_MEM_NULL);
  }
  kin_mem = (KINMem) kinmem;

  /* Test if the LS linear solver interface has been created */
  if (kin_mem->kin_lmem == NULL) {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_LMEM_NULL);
    return(KINLS_LMEM_NULL);
  }
  kinls_mem = (KINLsMem) kin_mem->kin_lmem;

  /* Test compatibility of NVECTOR package with the BBD preconditioner */
  /* Note: Do NOT need to check for N_VScale since has already been checked for in KINSOL */
  if (kin_mem->kin_vtemp1->ops->nvgetarraypointer == NULL) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_BAD_NVECTOR);
    return(KINLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (KBBDPrecData) malloc(sizeof *pdata);
  if (pdata == NULL) {
    KINProcessError(kin_mem, KINLS_MEM_FAIL,
                    "KINBBDPRE", "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  /* Set pointers to gloc and gcomm; load half-bandwidths */
  pdata->kin_mem = kinmem;
  pdata->gloc = gloc;
  pdata->gcomm = gcomm;
  pdata->mudq = SUNMIN(Nlocal-1, SUNMAX(0, mudq));
  pdata->mldq = SUNMIN(Nlocal-1, SUNMAX(0, mldq));
  muk = SUNMIN(Nlocal-1, SUNMAX(0, mukeep));
  mlk = SUNMIN(Nlocal-1, SUNMAX(0, mlkeep));
  pdata->mukeep = muk;
  pdata->mlkeep = mlk;

  /* Set extended upper half-bandwidth for PP (required for pivoting) */
  storage_mu = SUNMIN(Nlocal-1, muk+mlk);

  /* Allocate memory for preconditioner matrix */
  pdata->PP = NULL;
  pdata->PP = SUNBandMatrixStorage(Nlocal, muk, mlk, storage_mu);
  if (pdata->PP == NULL) {
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  /* Allocate memory for temporary N_Vectors */
  pdata->zlocal = NULL;
  pdata->zlocal = N_VNew_Serial(Nlocal);
  if (pdata->zlocal == NULL) {
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE", 
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  pdata->rlocal = NULL;
  pdata->rlocal = N_VNewEmpty_Serial(Nlocal); /* empty vector */
  if (pdata->rlocal == NULL) {
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  pdata->tempv1 = NULL;
  pdata->tempv1 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv1 == NULL) {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  pdata->tempv2 = NULL;
  pdata->tempv2 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv2 == NULL) {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  pdata->tempv3 = NULL;
  pdata->tempv3 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv3 == NULL) {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(pdata->zlocal, pdata->PP);
  if (pdata->LS == NULL) {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  flag = SUNLinSolInitialize(pdata->LS);
  if (flag != SUNLS_SUCCESS) {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    SUNMatDestroy(pdata->PP);
    SUNLinSolFree(pdata->LS);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_SUNLS_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_SUNLS_FAIL);
    return(KINLS_SUNLS_FAIL);
  }

  /* Set rel_uu based on input value dq_rel_uu (0 implies default) */
  pdata->rel_uu = (dq_rel_uu > ZERO) ? dq_rel_uu : SUNRsqrt(kin_mem->kin_uround);

  /* Store Nlocal to be used in KINBBDPrecSetup */
  pdata->n_local = Nlocal;

  /* Set work space sizes and initialize nge */
  pdata->rpwsize = 0;
  pdata->ipwsize = 0;
  if (kin_mem->kin_vtemp1->ops->nvspace) {
    N_VSpace(kin_mem->kin_vtemp1, &lrw1, &liw1);
    pdata->rpwsize += 3*lrw1;
    pdata->ipwsize += 3*liw1;
  }
  if (pdata->zlocal->ops->nvspace) {
    N_VSpace(pdata->zlocal, &lrw1, &liw1);
    pdata->rpwsize += lrw1;
    pdata->ipwsize += liw1;
  }
  if (pdata->rlocal->ops->nvspace) {
    N_VSpace(pdata->rlocal, &lrw1, &liw1);
    pdata->rpwsize += lrw1;
    pdata->ipwsize += liw1;
  }
  if (pdata->PP->ops->space) {
    flag = SUNMatSpace(pdata->PP, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->LS->ops->space) {
    flag = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  pdata->nge = 0;

  /* make sure pdata is free from any previous allocations */
  if (kinls_mem->pfree != NULL)
    kinls_mem->pfree(kin_mem);

  /* Point to the new pdata field in the LS memory */
  kinls_mem->pdata = pdata;

  /* Attach the pfree function */
  kinls_mem->pfree = KINBBDPrecFree;

  /* Attach preconditioner solve and setup functions */
  flag = KINSetPreconditioner(kinmem, KINBBDPrecSetup,
                              KINBBDPrecSolve);

  return(flag);
}